

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

ArrayPtr<const_capnp::word>
capnp::initMessageBuilderFromFlatArrayCopy
          (ArrayPtr<const_capnp::word> array,MessageBuilder *target,ReaderOptions options)

{
  PointerReader other;
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> AVar3;
  FlatArrayMessageReader reader;
  Reader local_160;
  PointerBuilder local_140;
  UnalignedFlatArrayMessageReader local_128;
  
  UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader(&local_128,array,options);
  local_128.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_0020e3d0;
  MessageReader::getRootInternal(&local_160,&local_128.super_MessageReader);
  MessageBuilder::getRootInternal((Builder *)&local_140,target);
  other.capTable = local_160.reader.capTable;
  other.segment = local_160.reader.segment;
  other.pointer = local_160.reader.pointer;
  other.nestingLimit = local_160.reader.nestingLimit;
  other._28_4_ = local_160.reader._28_4_;
  _::PointerBuilder::copyFrom(&local_140,other,false);
  sVar2 = local_128.moreSegments.size_;
  pAVar1 = local_128.moreSegments.ptr;
  local_128.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_0020fac8;
  if (local_128.moreSegments.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
    local_128.moreSegments.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_128.moreSegments.size_ = 0;
    (*(code *)**(undefined8 **)local_128.moreSegments.disposer)
              (local_128.moreSegments.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_128);
  AVar3.size_ = (long)((long)array.ptr + (array.size_ * 8 - (long)local_128.end)) >> 3;
  AVar3.ptr = local_128.end;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const word> initMessageBuilderFromFlatArrayCopy(
    kj::ArrayPtr<const word> array, MessageBuilder& target, ReaderOptions options) {
  FlatArrayMessageReader reader(array, options);
  target.setRoot(reader.getRoot<AnyPointer>());
  return kj::arrayPtr(reader.getEnd(), array.end());
}